

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::Trace(GB *this)

{
  byte local_49;
  char local_41;
  char local_39;
  char local_31;
  char local_29;
  GB *this_local;
  
  if (((this->s).op_tick == 0) && (((this->s).tick & 1U) == 0)) {
    local_29 = 'z';
    if (((this->s).field_2.field_0.f & 0x80) == 0) {
      local_29 = '-';
    }
    local_31 = 'n';
    if (((this->s).field_2.field_0.f & 0x40) == 0) {
      local_31 = '-';
    }
    local_39 = 'h';
    if (((this->s).field_2.field_0.f & 0x20) == 0) {
      local_39 = '-';
    }
    local_41 = 'c';
    if (((this->s).field_2.field_0.f & 0x10) == 0) {
      local_41 = '-';
    }
    printf("a:%02x f:%c%c%c%c bc:%04x de:%04x hl:%04x sp:%04x pc:%04x",
           (ulong)(this->s).field_2.field_0.a,(ulong)(uint)(int)local_29,(ulong)(uint)(int)local_31,
           (ulong)(uint)(int)local_39,(ulong)(uint)(int)local_41,(uint)(this->s).field_3.bc,
           (uint)(this->s).field_4.de,(uint)(this->s).field_5.hl,(uint)(this->s).sp,
           (uint)(this->s).pc);
    clocks(this);
    printf(" (cy: %.f)");
    local_49 = 0x2b;
    if (((this->s).io[0x40] & 0x80) == 0) {
      local_49 = 0x2d;
    }
    printf(" ppu:%c%u",(ulong)(uint)(int)(char)local_49,(ulong)((this->s).io[0x41] & 3),
           (ulong)local_49);
    printf(" LY:%u",(ulong)(this->s).io[0x44]);
    printf(" |");
    PrintInstruction(this,(this->s).pc);
    printf("\n");
  }
  return;
}

Assistant:

void GB::Trace() {
  if (s.op_tick == 0 && (s.tick & 1) == 0) {
    printf("a:%02x f:%c%c%c%c bc:%04x de:%04x hl:%04x sp:%04x pc:%04x", s.a,
           (s.f & FZ) ? 'z' : '-', (s.f & FN) ? 'n' : '-',
           (s.f & FH) ? 'h' : '-', (s.f & FC) ? 'c' : '-', s.bc, s.de, s.hl,
           s.sp, s.pc);
    printf(" (cy: %.f)", clocks());
    printf(" ppu:%c%u", s.io[LCDC] & 0x80 ? '+' : '-', s.io[STAT] & 3);
    printf(" LY:%u", s.io[LY]);
    printf(" |");
    PrintInstruction(s.pc);
    printf("\n");
  }
}